

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlStrcat(xmlChar *cur,xmlChar *add)

{
  xmlChar *local_28;
  xmlChar *p;
  xmlChar *add_local;
  xmlChar *cur_local;
  
  cur_local = cur;
  if (add != (xmlChar *)0x0) {
    local_28 = add;
    if (cur == (xmlChar *)0x0) {
      cur_local = xmlStrdup(add);
    }
    else {
      for (; *local_28 != '\0'; local_28 = local_28 + 1) {
      }
      cur_local = xmlStrncat(cur,add,(int)local_28 - (int)add);
    }
  }
  return cur_local;
}

Assistant:

xmlChar *
xmlStrcat(xmlChar *cur, const xmlChar *add) {
    const xmlChar *p = add;

    if (add == NULL) return(cur);
    if (cur == NULL)
        return(xmlStrdup(add));

    while (*p != 0) p++; /* non input consuming */
    return(xmlStrncat(cur, add, p - add));
}